

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O3

void __thiscall DynamicGraphTest::DynamicGraphTest(DynamicGraphTest *this)

{
  _Rb_tree_header *p_Var1;
  StoredVertexList *this_00;
  size_t *psVar2;
  _List_node_base *p_Var3;
  AdjList *g;
  pair<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_bool>
  pVar4;
  back_insertion_sequence_tag local_48;
  stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>
  local_40;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR_run_00120bd8;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>
  ::adjacency_list(&(this->G).super_UndirectedGraph,(no_property *)&local_40);
  p_Var1 = &(this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header;
  (this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->G).components.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->G).components.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->G).components.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->G).level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->G).level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->G).level.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->G).virtualEdges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->G).nextComponent = 0;
  (this->G).relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->G).relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->G).relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->G).relatives.super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  this_00 = &(this->G).super_UndirectedGraph.super_type.m_vertices;
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,2);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x0;
  p_Var3[1]._M_prev = (_List_node_base *)0x1;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 1;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)(this->G).super_UndirectedGraph.super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,3);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x0;
  p_Var3[1]._M_prev = (_List_node_base *)0x2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 2;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)(this->G).super_UndirectedGraph.super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x61) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,4);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x2;
  p_Var3[1]._M_prev = (_List_node_base *)0x3;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 3;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 2;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0xa1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,6);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x4;
  p_Var3[1]._M_prev = (_List_node_base *)&DAT_00000005;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 5;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 4;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0xc1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,7);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x4;
  p_Var3[1]._M_prev = (_List_node_base *)0x6;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 6;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 4;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 6),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0xc1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,7);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x6;
  p_Var3[1]._M_prev = (_List_node_base *)&DAT_00000005;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 5;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 6),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 6;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x101) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,9);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x7;
  p_Var3[1]._M_prev = (_List_node_base *)&DAT_00000008;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 8;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 7),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 7;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 8),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x141) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xb);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x9;
  p_Var3[1]._M_prev = (_List_node_base *)0xa;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 10;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 9),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 9;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 10),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x161) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xc);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x9;
  p_Var3[1]._M_prev = (_List_node_base *)0xb;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xb;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 9),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 9;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xb),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x161) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xc);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xa;
  p_Var3[1]._M_prev = (_List_node_base *)0xb;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xb;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 10),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 10;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xb),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1a1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xe);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xd;
  p_Var3[1]._M_prev = (_List_node_base *)0xb;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xb;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xd),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xd;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xb),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1e1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x10);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xf;
  p_Var3[1]._M_prev = (_List_node_base *)0xb;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xb;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xf),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xf;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xb),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x181) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xd);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xa;
  p_Var3[1]._M_prev = (_List_node_base *)0xc;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xc;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 10),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 10;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xc),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1a1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xe);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xc;
  p_Var3[1]._M_prev = (_List_node_base *)0xd;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xd;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xc),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xc;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xd),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1c1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0xf);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xe;
  p_Var3[1]._M_prev = (_List_node_base *)0xd;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xd;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xe),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xe;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xd),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1e1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x10);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xe;
  p_Var3[1]._M_prev = (_List_node_base *)0xf;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xf;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xe),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xe;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xf),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x1e1) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x10);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0xd;
  p_Var3[1]._M_prev = (_List_node_base *)0xf;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0xf;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xd),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0xd;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0xf),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x221) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x12);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x10;
  p_Var3[1]._M_prev = (_List_node_base *)&DAT_00000011;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0x11;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x10),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0x10;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0x11),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x261) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x14);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x10;
  p_Var3[1]._M_prev = (_List_node_base *)0x13;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0x13;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x10),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0x10;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0x13),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x241) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x13);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x12;
  p_Var3[1]._M_prev = (_List_node_base *)&DAT_00000011;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0x11;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x12),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0x12;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0x11),&local_40,&local_48);
  }
  if ((ulong)((long)*(pointer *)
                     ((long)&(this->G).super_UndirectedGraph.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
             (long)(this->G).super_UndirectedGraph.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x261) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(this_00,0x14);
  }
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = (_List_node_base *)0x12;
  p_Var3[1]._M_prev = (_List_node_base *)0x13;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar2 = (size_t *)
           ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar2 = *psVar2 + 1;
  p_Var3 = *(_List_node_base **)
            ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                    ._M_impl._M_node + 8);
  local_40.super_stored_edge<unsigned_long>.m_target = 0x13;
  local_48 = (back_insertion_sequence_tag)&Action::vtable;
  local_40.m_iter._M_node = p_Var3;
  pVar4 = boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                      *)((this->G).super_UndirectedGraph.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x12),&local_40,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    psVar2 = (size_t *)
             ((long)&(this->G).super_UndirectedGraph.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                     ._M_impl._M_node + 0x10);
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
  }
  else {
    local_40.super_stored_edge<unsigned_long>.m_target = 0x12;
    local_48 = (back_insertion_sequence_tag)&Action::vtable;
    local_40.m_iter._M_node = p_Var3;
    boost::graph_detail::
    push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>
              ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                *)((this_00->
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0x13),&local_40,&local_48);
  }
  return;
}

Assistant:

DynamicGraphTest::DynamicGraphTest()
{
    add_edge(0, 1, this->G);
    add_edge(0, 2, this->G);
    add_edge(2, 3, this->G);

    add_edge(4, 5, this->G);
    add_edge(4, 6, this->G);
    add_edge(6, 5, this->G);

    add_edge(7, 8, this->G);

    add_edge(9, 10, this->G);
    add_edge(9, 11, this->G);
    add_edge(10, 11, this->G);
    add_edge(13, 11, this->G);
    add_edge(15, 11, this->G);
    add_edge(10, 12, this->G);
    add_edge(12, 13, this->G);
    add_edge(14, 13, this->G);
    add_edge(14, 15, this->G);
    add_edge(13, 15, this->G);

    add_edge(16, 17, this->G);
    add_edge(16, 19, this->G);
    add_edge(18, 17, this->G);
    add_edge(18, 19, this->G);

}